

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

int av1_get_q_for_deltaq_objective
              (AV1_COMP *cpi,ThreadData_conflict *td,int64_t *delta_dist,BLOCK_SIZE bsize,int mi_row
              ,int mi_col)

{
  byte right_shift;
  byte bVar1;
  int iVar2;
  TplDepFrame *pTVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int16_t iVar9;
  int16_t iVar10;
  int iVar11;
  int iVar12;
  undefined7 in_register_00000009;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int qindex;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int row;
  long lVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  
  qindex = (cpi->common).quant_params.base_qindex;
  if (cpi->gf_frame_index < 0x60) {
    pTVar3 = (cpi->ppi->tpl_data).tpl_frame;
    uVar18 = (ulong)((uint)cpi->gf_frame_index * 0x60);
    if (*(char *)((long)pTVar3->ref_map_index + (uVar18 - 0x20)) != '\0') {
      right_shift = (cpi->ppi->tpl_data).tpl_stats_block_mis_log2;
      uVar13 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
      lVar14 = *(long *)((long)pTVar3->ref_map_index + (uVar18 - 0x18));
      iVar15 = *(int *)((long)pTVar3->ref_map_index + uVar18 + 0x20);
      bVar1 = (cpi->common).superres_scale_denominator;
      iVar12 = (uint)bVar1 * mi_col;
      iVar20 = iVar12 + 4;
      iVar12 = iVar12 + 0xb;
      if (-1 < iVar20) {
        iVar12 = iVar20;
      }
      iVar19 = ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [uVar13] + mi_col) * (uint)bVar1;
      iVar20 = iVar19 + 4;
      iVar19 = iVar19 + 0xb;
      if (-1 < iVar20) {
        iVar19 = iVar20;
      }
      iVar2 = (cpi->common).superres_upscaled_width;
      iVar17 = (uint)bVar1 << (right_shift & 0x1f);
      iVar20 = iVar17 + 4;
      iVar17 = iVar17 + 0xb;
      if (-1 < iVar20) {
        iVar17 = iVar20;
      }
      iVar16 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar13] + mi_row;
      dVar28 = 0.0;
      dVar29 = 0.0;
      dVar27 = 1.0;
      dVar26 = 0.0;
      dVar24 = 0.0;
      dVar25 = 0.0;
      dVar23 = 0.0;
      iVar20 = iVar12 >> 3;
      do {
        for (; iVar20 < iVar19 >> 3; iVar20 = iVar20 + (iVar17 >> 3)) {
          if ((mi_row < (cpi->common).mi_params.mi_rows) &&
             (iVar20 < (int)(iVar2 + 7 >> 2 & 0xfffffffeU))) {
            iVar11 = av1_tpl_ptr_pos(mi_row,iVar20,iVar15,right_shift);
            lVar21 = (long)iVar11 * 200;
            dVar6 = (double)*(long *)(lVar14 + 8 + lVar21);
            iVar11 = *(int *)((long)pTVar3->ref_map_index + uVar18 + 0x34);
            lVar4 = *(long *)(lVar14 + 0x40 + lVar21);
            lVar5 = *(long *)(lVar14 + 0x48 + lVar21);
            dVar7 = (double)(*(long *)(lVar14 + 0x18 + lVar21) << 7);
            dVar8 = log(dVar7);
            dVar26 = dVar26 + dVar8 * dVar6;
            dVar22 = (double)(lVar5 * 0x80 + (iVar11 * lVar4 + 0x100 >> 9));
            dVar8 = log(dVar7 + dVar22);
            dVar7 = log(dVar7 * 3.0 + dVar22);
            dVar28 = dVar28 + dVar6 * dVar7;
            dVar29 = dVar29 + dVar6 * dVar8;
            dVar24 = dVar24 + (double)(*(long *)(lVar14 + 8 + lVar21) << 7);
            dVar25 = dVar25 + (double)(*(long *)(lVar14 + lVar21) << 7);
            dVar23 = dVar23 + (double)(*(int *)(lVar14 + 0x90 + lVar21) << 4);
            dVar27 = dVar27 + dVar6;
          }
        }
        mi_row = mi_row + (1 << (right_shift & 0x1f));
        iVar20 = iVar12 >> 3;
      } while (mi_row < iVar16);
      if ((0.0 < dVar29) && (0.0 < dVar26)) {
        dVar6 = (cpi->rd).r0;
        dVar29 = exp((dVar26 - dVar29) / dVar27);
        dVar26 = exp((dVar26 - dVar28) / dVar27);
        (td->mb).rb = dVar26;
        iVar12 = av1_get_deltaq_offset(((cpi->common).seq_params)->bit_depth,qindex,dVar6 / dVar29);
        iVar20 = (cpi->common).delta_q_info.delta_q_res;
        iVar15 = iVar20 * 9 + -1;
        if (iVar12 < iVar15) {
          iVar15 = iVar12;
        }
        iVar20 = iVar20 * -9 + 1;
        if (iVar20 < iVar15) {
          iVar20 = iVar15;
        }
        iVar15 = (cpi->common).quant_params.base_qindex + iVar20;
        if (0xfe < iVar15) {
          iVar15 = 0xff;
        }
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        iVar9 = av1_dc_quant_QTX(qindex,0,((cpi->common).seq_params)->bit_depth);
        iVar10 = av1_dc_quant_QTX(qindex,iVar20,((cpi->common).seq_params)->bit_depth);
        qindex = iVar15;
        if (delta_dist != (int64_t *)0x0) {
          dVar26 = (double)(int)iVar10 / (double)(int)iVar9;
          dVar26 = dVar26 * dVar26 * dVar24;
          if (dVar25 <= dVar26) {
            dVar26 = dVar25;
          }
          lVar14 = (long)*(int *)((long)pTVar3->ref_map_index + uVar18 + 0x34);
          *delta_dist = ((long)(((double)(int)iVar9 / (double)(int)iVar10) * dVar23 - dVar23) *
                         lVar14 + 0x100 >> 9) + (long)((dVar26 - dVar24) / dVar29) + lVar14 * 2;
        }
      }
    }
  }
  return qindex;
}

Assistant:

int av1_get_q_for_deltaq_objective(AV1_COMP *const cpi, ThreadData *td,
                                   int64_t *delta_dist, BLOCK_SIZE bsize,
                                   int mi_row, int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  double intra_cost = 0;
  double mc_dep_reg = 0;
  double mc_dep_cost = 0;
  double cbcmp_base = 1;
  double srcrf_dist = 0;
  double srcrf_sse = 0;
  double srcrf_rate = 0;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];
  const int base_qindex = cm->quant_params.base_qindex;

  if (tpl_idx >= MAX_TPL_FRAME_IDX) return base_qindex;

  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  int tpl_stride = tpl_frame->stride;
  if (!tpl_frame->is_valid) return base_qindex;

#ifndef NDEBUG
  int mi_count = 0;
#endif
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      coded_to_superres_mi(mi_col + mi_wide, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int step = 1 << block_mis_log2;
  const int row_step = step;
  const int col_step_sr =
      coded_to_superres_mi(step, cm->superres_scale_denominator);
  for (int row = mi_row; row < mi_row + mi_high; row += row_step) {
    for (int col = mi_col_sr; col < mi_col_end_sr; col += col_step_sr) {
      if (row >= cm->mi_params.mi_rows || col >= mi_cols_sr) continue;
      TplDepStats *this_stats =
          &tpl_stats[av1_tpl_ptr_pos(row, col, tpl_stride, block_mis_log2)];
      double cbcmp = (double)this_stats->srcrf_dist;
      int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
      intra_cost += log(dist_scaled) * cbcmp;
      mc_dep_cost += log(dist_scaled + mc_dep_delta) * cbcmp;
      mc_dep_reg += log(3 * dist_scaled + mc_dep_delta) * cbcmp;
      srcrf_dist += (double)(this_stats->srcrf_dist << RDDIV_BITS);
      srcrf_sse += (double)(this_stats->srcrf_sse << RDDIV_BITS);
      srcrf_rate += (double)(this_stats->srcrf_rate << TPL_DEP_COST_SCALE_LOG2);
#ifndef NDEBUG
      mi_count++;
#endif
      cbcmp_base += cbcmp;
    }
  }
  assert(mi_count <= MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);

  int offset = 0;
  double beta = 1.0;
  double rk;
  if (mc_dep_cost > 0 && intra_cost > 0) {
    const double r0 = cpi->rd.r0;
    rk = exp((intra_cost - mc_dep_cost) / cbcmp_base);
    td->mb.rb = exp((intra_cost - mc_dep_reg) / cbcmp_base);
    beta = (r0 / rk);
    assert(beta > 0.0);
  } else {
    return base_qindex;
  }
  offset = av1_get_deltaq_offset(cm->seq_params->bit_depth, base_qindex, beta);

  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  offset = AOMMIN(offset, delta_q_info->delta_q_res * 9 - 1);
  offset = AOMMAX(offset, -delta_q_info->delta_q_res * 9 + 1);
  int qindex = cm->quant_params.base_qindex + offset;
  qindex = AOMMIN(qindex, MAXQ);
  qindex = AOMMAX(qindex, MINQ);

  int frm_qstep = av1_dc_quant_QTX(base_qindex, 0, cm->seq_params->bit_depth);
  int sbs_qstep =
      av1_dc_quant_QTX(base_qindex, offset, cm->seq_params->bit_depth);

  if (delta_dist) {
    double sbs_dist = srcrf_dist * pow((double)sbs_qstep / frm_qstep, 2.0);
    double sbs_rate = srcrf_rate * ((double)frm_qstep / sbs_qstep);
    sbs_dist = AOMMIN(sbs_dist, srcrf_sse);
    *delta_dist = (int64_t)((sbs_dist - srcrf_dist) / rk);
    *delta_dist += RDCOST(tpl_frame->base_rdmult, 4 * 256, 0);
    *delta_dist += RDCOST(tpl_frame->base_rdmult, sbs_rate - srcrf_rate, 0);
  }
  return qindex;
}